

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

void m_respond(monst *mtmp)

{
  int iVar1;
  char *pcVar2;
  int local_14;
  int i;
  monst *mtmp_local;
  
  if (mtmp->data->msound == '\x0f') {
    if (flags.soundok != '\0') {
      pcVar2 = Monnam(mtmp);
      pline("%s shrieks.",pcVar2);
      stop_occupation();
    }
    iVar1 = rn2(10);
    if (iVar1 == 0) {
      iVar1 = rn2(0xd);
      if (iVar1 == 0) {
        makemon(mons + 0x77,level,0,0,0);
      }
      else {
        makemon((permonst *)0x0,level,0,0,0);
      }
    }
    aggravate();
  }
  if (mtmp->data == mons + 0x127) {
    for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
      if (mtmp->data->mattk[local_14].aatyp == '\x0f') {
        gazemu(mtmp,mtmp->data->mattk + local_14);
        return;
      }
    }
  }
  return;
}

Assistant:

void m_respond(struct monst *mtmp)
{
    if (mtmp->data->msound == MS_SHRIEK) {
	if (flags.soundok) {
	    pline("%s shrieks.", Monnam(mtmp));
	    stop_occupation();
	}
	if (!rn2(10)) {
	    if (!rn2(13))
		makemon(&mons[PM_PURPLE_WORM], level, 0, 0, NO_MM_FLAGS);
	    else
		makemon(NULL, level, 0, 0, NO_MM_FLAGS);

	}
	aggravate();
    }
    if (mtmp->data == &mons[PM_MEDUSA]) {
	int i;
	for (i = 0; i < NATTK; i++)
	     if (mtmp->data->mattk[i].aatyp == AT_GAZE) {
		 gazemu(mtmp, &mtmp->data->mattk[i]);
		 break;
	     }
    }
}